

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressbar.cpp
# Opt level: O2

void __thiscall QtMWidgets::ProgressBar::setValue(ProgressBar *this,int value)

{
  int iVar1;
  ProgressBarPrivate *pPVar2;
  bool bVar3;
  QAccessibleValueChangeEvent event;
  QVariant QStack_78;
  QAccessibleValueChangeEvent local_58 [64];
  
  pPVar2 = (this->d).d;
  iVar1 = pPVar2->minimum;
  if (iVar1 + -1 == value) {
    reset(this);
    return;
  }
  if ((pPVar2->value != value) &&
     (iVar1 <= value && value <= pPVar2->maximum || pPVar2->maximum == 0 && iVar1 == 0)) {
    pPVar2->value = value;
    valueChanged(this,value);
    if ((*(byte *)(*(long *)&this->field_0x20 + 9) & 0x80) != 0) {
      QVariant::QVariant(&QStack_78,value);
      QAccessibleValueChangeEvent::QAccessibleValueChangeEvent(local_58,(QObject *)this,&QStack_78);
      QVariant::~QVariant(&QStack_78);
      QAccessible::updateAccessibility((QAccessibleEvent *)local_58);
      QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent(local_58);
    }
    bVar3 = ProgressBarPrivate::repaintRequired((this->d).d);
    if (bVar3) {
      QWidget::repaint();
    }
    pPVar2 = (this->d).d;
    if (pPVar2->animate == true) {
      pPVar2->animate = false;
      QAbstractAnimation::stop();
      QWidget::repaint();
    }
  }
  return;
}

Assistant:

void
ProgressBar::setValue( int value )
{
	if( value == d->minimum - 1 )
	{
		reset();

		return;
	}

	if( d->value == value
		|| ( ( value > d->maximum || value < d->minimum )
			&& ( d->maximum != 0 || d->minimum != 0 ) ) )
		return;

	d->value = value;

	emit valueChanged( value );

#ifndef QT_NO_ACCESSIBILITY
	if( isVisible() )
	{
		QAccessibleValueChangeEvent event( this, value );
		QAccessible::updateAccessibility( &event );
	}
#endif

	if( d->repaintRequired() )
		repaint();

	if( d->animate )
	{
		d->animate = false;

		d->animation->stop();

		repaint();
	}
}